

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O0

shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
 __thiscall
pstore::index::
get_index<(pstore::trailer::indices)4,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
          (index *this,database *db,bool create)

{
  bool bVar1;
  __shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  element_type *peVar3;
  const_reference pvVar4;
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  sVar5;
  long local_a8;
  undefined1 local_78 [32];
  _Head_base<0UL,_pstore::system_page_size_interface_*,_false> local_58 [3];
  __uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_> local_40;
  typed_address<pstore::index::header_block> location;
  shared_ptr<const_pstore::trailer> footer;
  shared_ptr<pstore::index::index_base> *dx;
  bool create_local;
  database *db_local;
  
  this_00 = &database::get_mutable_index(db,path)->
             super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>;
  peVar2 = std::__shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  if (peVar2 == (element_type *)0x0) {
    database::get_footer((database *)&location);
    peVar3 = std::
             __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&location);
    pvVar4 = std::array<pstore::typed_address<pstore::index::header_block>,_6UL>::at
                       (&(peVar3->a).index_records,4);
    local_40._M_t.
    super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
    .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
         (tuple<pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
         (pvVar4->a_).a_;
    local_58[0]._M_head_impl =
         (system_page_size_interface *)typed_address<pstore::index::header_block>::null();
    bVar1 = typed_address<pstore::index::header_block>::operator==
                      ((typed_address<pstore::index::header_block> *)&local_40,
                       (typed_address<pstore::index::header_block> *)local_58);
    if (bVar1) {
      if (create) {
        std::
        make_shared<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>,pstore::database_const&>
                  ((database *)(local_78 + 0x10));
        std::shared_ptr<pstore::index::index_base>::operator=
                  ((shared_ptr<pstore::index::index_base> *)this_00,
                   (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                    *)(local_78 + 0x10));
        std::
        shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
        ::~shared_ptr((shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                       *)(local_78 + 0x10));
      }
    }
    else {
      std::
      make_shared<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>,pstore::database_const&,pstore::typed_address<pstore::index::header_block>const&>
                ((database *)local_78,(typed_address<pstore::index::header_block> *)db);
      std::shared_ptr<pstore::index::index_base>::operator=
                ((shared_ptr<pstore::index::index_base> *)this_00,
                 (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                  *)local_78);
      std::
      shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
      ::~shared_ptr((shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                     *)local_78);
    }
    std::shared_ptr<const_pstore::trailer>::~shared_ptr
              ((shared_ptr<const_pstore::trailer> *)&location);
  }
  if ((create) ||
     (peVar2 = std::__shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>::get
                         (this_00), peVar2 != (element_type *)0x0)) {
    peVar2 = std::__shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar2 == (element_type *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = __dynamic_cast(peVar2,&index_base::typeinfo,
                                &hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
                                 ::typeinfo,0);
    }
    if (local_a8 == 0) {
      assert_failed("(!create && dx.get () == nullptr) || dynamic_cast<Return *> (dx.get ()) != nullptr"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/index_types.hpp"
                    ,0x93);
    }
  }
  sVar5 = std::
          static_pointer_cast<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const,pstore::index::index_base>
                    ((shared_ptr<pstore::index::index_base> *)this);
  sVar5.
  super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
          )sVar5.
           super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Return> get_index (Database & db, bool const create = true) {
            auto & dx = db.get_mutable_index (Index);

            // Have we already loaded this index?
            if (dx.get () == nullptr) {
                std::shared_ptr<trailer const> const footer = db.get_footer ();
                typed_address<index::header_block> const location = footer->a.index_records.at (
                    static_cast<typename std::underlying_type<decltype (Index)>::type> (Index));
                if (location == decltype (location)::null ()) {
                    if (create) {
                        // Create a new (empty) index.
                        dx = std::make_shared<typename std::remove_const<Return>::type> (db);
                    }
                } else {
                    // Construct the index from the location.
                    dx = std::make_shared<typename std::remove_const<Return>::type> (db, location);
                }
            }

#ifdef PSTORE_CPP_RTTI
            PSTORE_ASSERT ((!create && dx.get () == nullptr) ||
                           dynamic_cast<Return *> (dx.get ()) != nullptr);
#endif
            return std::static_pointer_cast<Return> (dx);
        }